

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_factory.cpp
# Opt level: O0

unique_ptr<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_> __thiscall
n_e_s::core::CpuFactory::create_mos6502
          (CpuFactory *this,CpuRegisters *registers,IMmu *mmu,IPpu *ppu)

{
  __single_object _Var1;
  anon_class_8_1_ba1d6e4e local_58;
  function<void_()> local_50;
  unique_ptr<n_e_s::core::Mos6502,_std::default_delete<n_e_s::core::Mos6502>_> local_30;
  __single_object cpu;
  IPpu *ppu_local;
  IMmu *mmu_local;
  CpuRegisters *registers_local;
  
  cpu._M_t.super___uniq_ptr_impl<n_e_s::core::Mos6502,_std::default_delete<n_e_s::core::Mos6502>_>.
  _M_t.super__Tuple_impl<0UL,_n_e_s::core::Mos6502_*,_std::default_delete<n_e_s::core::Mos6502>_>.
  super__Head_base<0UL,_n_e_s::core::Mos6502_*,_false>._M_head_impl =
       (__uniq_ptr_data<n_e_s::core::Mos6502,_std::default_delete<n_e_s::core::Mos6502>,_true,_true>
       )(__uniq_ptr_data<n_e_s::core::Mos6502,_std::default_delete<n_e_s::core::Mos6502>,_true,_true>
         )ppu;
  mmu_local = (IMmu *)registers;
  registers_local = (CpuRegisters *)this;
  std::make_unique<n_e_s::core::Mos6502,n_e_s::core::CpuRegisters*const&,n_e_s::core::IMmu*const&>
            ((CpuRegisters **)&local_30,&mmu_local);
  _Var1._M_t.super___uniq_ptr_impl<n_e_s::core::Mos6502,_std::default_delete<n_e_s::core::Mos6502>_>
  ._M_t.super__Tuple_impl<0UL,_n_e_s::core::Mos6502_*,_std::default_delete<n_e_s::core::Mos6502>_>.
  super__Head_base<0UL,_n_e_s::core::Mos6502_*,_false>._M_head_impl =
       cpu._M_t.
       super___uniq_ptr_impl<n_e_s::core::Mos6502,_std::default_delete<n_e_s::core::Mos6502>_>._M_t.
       super__Tuple_impl<0UL,_n_e_s::core::Mos6502_*,_std::default_delete<n_e_s::core::Mos6502>_>.
       super__Head_base<0UL,_n_e_s::core::Mos6502_*,_false>._M_head_impl;
  local_58.ptr = std::unique_ptr<n_e_s::core::Mos6502,_std::default_delete<n_e_s::core::Mos6502>_>::
                 get(&local_30);
  std::function<void()>::
  function<n_e_s::core::CpuFactory::create_mos6502(n_e_s::core::CpuRegisters*,n_e_s::core::IMmu*,n_e_s::core::IPpu*)::__0,void>
            ((function<void()> *)&local_50,&local_58);
  (**(code **)(*(long *)_Var1._M_t.
                        super___uniq_ptr_impl<n_e_s::core::Mos6502,_std::default_delete<n_e_s::core::Mos6502>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_n_e_s::core::Mos6502_*,_std::default_delete<n_e_s::core::Mos6502>_>
                        .super__Head_base<0UL,_n_e_s::core::Mos6502_*,_false>._M_head_impl + 0x28))
            (_Var1._M_t.
             super___uniq_ptr_impl<n_e_s::core::Mos6502,_std::default_delete<n_e_s::core::Mos6502>_>
             ._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::Mos6502_*,_std::default_delete<n_e_s::core::Mos6502>_>
             .super__Head_base<0UL,_n_e_s::core::Mos6502_*,_false>._M_head_impl,&local_50);
  std::function<void_()>::~function(&local_50);
  std::unique_ptr<n_e_s::core::IMos6502,std::default_delete<n_e_s::core::IMos6502>>::
  unique_ptr<n_e_s::core::Mos6502,std::default_delete<n_e_s::core::Mos6502>,void>
            ((unique_ptr<n_e_s::core::IMos6502,std::default_delete<n_e_s::core::IMos6502>> *)this,
             &local_30);
  std::unique_ptr<n_e_s::core::Mos6502,_std::default_delete<n_e_s::core::Mos6502>_>::~unique_ptr
            (&local_30);
  return (__uniq_ptr_data<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>,_true,_true>
          )(__uniq_ptr_data<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<IMos6502> CpuFactory::create_mos6502(
        CpuRegisters *const registers,
        IMmu *const mmu,
        IPpu *const ppu) {
    auto cpu = std::make_unique<Mos6502>(registers, mmu);
    ppu->set_nmi_handler([ptr = cpu.get()] { ptr->set_nmi(true); });
    return cpu;
}